

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

bool __thiscall Gluco::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  Clause *pCVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  this->merges = this->merges + 1;
  pCVar5 = _qs;
  if (*(int *)&(_ps->header).field_0x4 < *(int *)&(_qs->header).field_0x4) {
    pCVar5 = _ps;
    _ps = _qs;
  }
  *size = *(int *)&(_ps->header).field_0x4 + -1;
  iVar6 = *(int *)&(pCVar5->header).field_0x4;
  bVar3 = iVar6 < 1;
  if (0 < iVar6) {
    lVar8 = 0;
    do {
      uVar1 = *(uint *)(&pCVar5[1].header.field_0x0 + lVar8 * 4);
      iVar6 = (int)uVar1 >> 1;
      if (iVar6 != v) {
        uVar7 = 5;
        if (0 < (int)(*(ulong *)&_ps->header >> 0x20)) {
          uVar9 = 0;
          do {
            uVar2 = *(uint *)(&_ps[1].header.field_0x0 + uVar9 * 4);
            if ((int)uVar2 >> 1 == iVar6) {
              uVar7 = uVar2 ^ uVar1;
              if (uVar7 != 1) {
                uVar7 = 8;
              }
              break;
            }
            uVar9 = uVar9 + 1;
          } while (*(ulong *)&_ps->header >> 0x20 != uVar9);
        }
        if (uVar7 != 8) {
          if (uVar7 != 5) {
            return bVar3;
          }
          *size = *size + 1;
        }
      }
      lVar8 = lVar8 + 1;
      lVar4 = (long)*(int *)&(pCVar5->header).field_0x4;
      bVar3 = lVar4 <= lVar8;
    } while (lVar8 < lVar4);
  }
  return bVar3;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])) {
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}